

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduling_tests.hpp
# Opt level: O0

void test_multiple_unit_tasks(void)

{
  bool bVar1;
  size_type __n;
  reference this;
  reference this_00;
  __normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
  *__rhs;
  task_handle *h;
  iterator __end1;
  iterator __begin1;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  task_handle local_50;
  int local_40;
  int i;
  allocator<oqpi::task_handle> local_29;
  undefined1 local_28 [8];
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> handles;
  test __t;
  
  test::test((test *)((long)&handles.
                             super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             "test_multiple_unit_tasks");
  __n = (size_type)gTaskCount;
  std::allocator<oqpi::task_handle>::allocator(&local_29);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::vector
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)local_28,__n,&local_29
            );
  std::allocator<oqpi::task_handle>::~allocator(&local_29);
  for (local_40 = 0; local_40 < gTaskCount; local_40 = local_40 + 1) {
    std::__cxx11::to_string((string *)&__range1,local_40);
    std::operator+(&local_70,"Fibonacci_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
    oqpi::
    helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
    ::schedule_task<unsigned_long(&)(unsigned_long),unsigned_long_long_const&>
              ((helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                *)&local_50,&local_70,fibonacci,&gValue);
    this = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                     ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)local_28,
                      (long)local_40);
    oqpi::task_handle::operator=(this,&local_50);
    oqpi::task_handle::~task_handle(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&__range1);
  }
  __end1 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::begin
                     ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)local_28);
  h = (task_handle *)
      std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::end
                ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)local_28);
  while( true ) {
    __rhs = (__normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
             *)&h;
    bVar1 = __gnu_cxx::operator!=(&__end1,__rhs);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
              ::operator*(&__end1);
    oqpi::task_handle::wait(this_00,__rhs);
    __gnu_cxx::
    __normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
    ::operator++(&__end1);
  }
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)local_28);
  test::~test((test *)((long)&handles.
                              super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  return;
}

Assistant:

void test_multiple_unit_tasks()
{
    TEST_FUNC;

    std::vector<oqpi::task_handle> handles(gTaskCount);
    for (auto i = 0; i < gTaskCount; ++i)
    {
        handles[i] = oqpi_tk::schedule_task("Fibonacci_" + std::to_string(i), fibonacci, gValue);
    }
    for (auto &h : handles)
    {
        h.wait();
    }
}